

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

void Curl_failf(Curl_easy *data,char *fmt,...)

{
  undefined1 *puVar1;
  char *__dest;
  char in_AL;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char error [258];
  __va_list_tag local_1e8;
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  char local_118 [264];
  
  if (in_AL != '\0') {
    local_198 = in_XMM0_Qa;
    local_188 = in_XMM1_Qa;
    local_178 = in_XMM2_Qa;
    local_168 = in_XMM3_Qa;
    local_158 = in_XMM4_Qa;
    local_148 = in_XMM5_Qa;
    local_138 = in_XMM6_Qa;
    local_128 = in_XMM7_Qa;
  }
  if ((((data->set).field_0x97b & 0x40) != 0) || ((data->set).errorbuffer != (char *)0x0)) {
    local_1e8.gp_offset = 0x10;
    local_1e8.fp_offset = 0x30;
    local_1e8.overflow_arg_area = &ap[0].overflow_arg_area;
    local_1e8.reg_save_area = local_1c8;
    local_1b8 = in_RDX;
    local_1b0 = in_RCX;
    local_1a8 = in_R8;
    local_1a0 = in_R9;
    curl_mvsnprintf(local_118,0x100,fmt,&local_1e8);
    sVar2 = strlen(local_118);
    __dest = (data->set).errorbuffer;
    if ((__dest != (char *)0x0) && (((data->state).field_0x600 & 8) == 0)) {
      strcpy(__dest,local_118);
      puVar1 = &(data->state).field_0x600;
      *puVar1 = *puVar1 | 8;
    }
    if (((data->set).field_0x97b & 0x40) != 0) {
      (local_118 + sVar2)[0] = '\n';
      (local_118 + sVar2)[1] = '\0';
      Curl_debug(data,CURLINFO_TEXT,local_118,sVar2 + 1);
    }
  }
  return;
}

Assistant:

void Curl_failf(struct Curl_easy *data, const char *fmt, ...)
{
  if(data->set.verbose || data->set.errorbuffer) {
    va_list ap;
    size_t len;
    char error[CURL_ERROR_SIZE + 2];
    va_start(ap, fmt);
    (void)mvsnprintf(error, CURL_ERROR_SIZE, fmt, ap);
    len = strlen(error);

    if(data->set.errorbuffer && !data->state.errorbuf) {
      strcpy(data->set.errorbuffer, error);
      data->state.errorbuf = TRUE; /* wrote error string */
    }
    if(data->set.verbose) {
      error[len] = '\n';
      error[++len] = '\0';
      Curl_debug(data, CURLINFO_TEXT, error, len);
    }
    va_end(ap);
  }
}